

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int handle_ack_frequency_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  byte bVar1;
  byte *end;
  byte *pbVar2;
  st_quicly_application_space_t *psVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  int iVar7;
  
  iVar7 = 0x20007;
  if ((((conn->super).ctx)->transport_params).min_ack_delay_usec != 0xffffffffffffffff) {
    end = state->end;
    uVar4 = ptls_decode_quicint(&state->src,end);
    if (uVar4 != 0xffffffffffffffff) {
      uVar5 = ptls_decode_quicint(&state->src,end);
      if (1 < uVar5 + 1) {
        uVar6 = ptls_decode_quicint(&state->src,end);
        if ((uVar6 != 0xffffffffffffffff) && (pbVar2 = state->src, pbVar2 != end)) {
          state->src = pbVar2 + 1;
          bVar1 = *pbVar2;
          if ((bVar1 < 2) &&
             ((iVar7 = 0x2000a, uVar6 == 25000 &&
              (iVar7 = 0, (conn->ingress).ack_frequency.next_sequence <= uVar4)))) {
            uVar6 = 100;
            if (uVar5 < 100) {
              uVar6 = uVar5;
            }
            (conn->ingress).ack_frequency.next_sequence = uVar4 + 1;
            psVar3 = conn->application;
            (psVar3->super).packet_tolerance = (uint32_t)uVar6;
            (psVar3->super).ignore_order = bVar1;
          }
        }
      }
    }
  }
  return iVar7;
}

Assistant:

static int handle_ack_frequency_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_ack_frequency_frame_t frame;
    int ret;

    /* recognize the frame only when the support has been advertised */
    if (!recognize_delayed_ack(conn))
        return QUICLY_TRANSPORT_ERROR_FRAME_ENCODING;

    if ((ret = quicly_decode_ack_frequency_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    QUICLY_PROBE(ACK_FREQUENCY_RECEIVE, conn, conn->stash.now, frame.sequence, frame.packet_tolerance, frame.max_ack_delay,
                 frame.ignore_order);

    /* At the moment, the only value that the remote peer would send is this value, because our TP.min_ack_delay and max_ack_delay
     * are equal. */
    if (frame.max_ack_delay != QUICLY_LOCAL_MAX_ACK_DELAY * 1000)
        return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;

    if (frame.sequence >= conn->ingress.ack_frequency.next_sequence) {
        conn->ingress.ack_frequency.next_sequence = frame.sequence + 1;
        conn->application->super.packet_tolerance =
            (uint32_t)(frame.packet_tolerance < QUICLY_MAX_PACKET_TOLERANCE ? frame.packet_tolerance : QUICLY_MAX_PACKET_TOLERANCE);
        conn->application->super.ignore_order = frame.ignore_order;
    }

    return 0;
}